

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O0

filepos_t EBML_ReadCodedSizeValue(uint8_t *InBuffer,size_t *BufferSize,filepos_t *SizeUnknown)

{
  byte bVar1;
  uint local_4c;
  byte local_48 [4];
  uint i;
  uint8_t PossibleSize [8];
  uint PossibleSizeLength;
  uint SizeIdx;
  filepos_t Result;
  uint8_t SizeBitMask;
  filepos_t *SizeUnknown_local;
  size_t *BufferSize_local;
  uint8_t *InBuffer_local;
  
  *SizeUnknown = 0x7f;
  PossibleSize[4] = '\0';
  PossibleSize[5] = '\0';
  PossibleSize[6] = '\0';
  PossibleSize[7] = '\0';
  while( true ) {
    if (*BufferSize <= (ulong)(uint)PossibleSize._4_4_ || 7 < (uint)PossibleSize._4_4_) {
      *BufferSize = 0;
      return 0;
    }
    bVar1 = (byte)PossibleSize._4_4_;
    if (((uint)*InBuffer & 0x80 >> (bVar1 & 0x1f)) != 0) break;
    *SizeUnknown = *SizeUnknown << 7;
    *SizeUnknown = *SizeUnknown | 0xff;
    PossibleSize._4_4_ = PossibleSize._4_4_ + 1;
  }
  PossibleSize._0_4_ = PossibleSize._4_4_ + 1;
  PossibleSize[4] = '\0';
  PossibleSize[5] = '\0';
  PossibleSize[6] = '\0';
  PossibleSize[7] = '\0';
  for (; (uint)PossibleSize._4_4_ < (uint)PossibleSize._0_4_;
      PossibleSize._4_4_ = PossibleSize._4_4_ + 1) {
    local_48[(uint)PossibleSize._4_4_] = InBuffer[(uint)PossibleSize._4_4_];
  }
  PossibleSize[4] = '\0';
  PossibleSize[5] = '\0';
  PossibleSize[6] = '\0';
  PossibleSize[7] = '\0';
  for (; (uint)PossibleSize._4_4_ < PossibleSize._0_4_ - 1;
      PossibleSize._4_4_ = PossibleSize._4_4_ + 1) {
  }
  _PossibleSizeLength =
       (ulong)(int)((uint)local_48[0] & (0x80 >> (bVar1 & 0x1f) & 0xffU ^ 0xffffffff));
  for (local_4c = 1; local_4c < (uint)PossibleSize._0_4_; local_4c = local_4c + 1) {
    _PossibleSizeLength = (ulong)local_48[local_4c] | _PossibleSizeLength << 8;
  }
  *BufferSize = (ulong)(uint)PossibleSize._0_4_;
  return _PossibleSizeLength;
}

Assistant:

filepos_t EBML_ReadCodedSizeValue(const uint8_t *InBuffer, size_t *BufferSize, filepos_t *SizeUnknown)
{
    uint8_t SizeBitMask = 1 << 7;
    filepos_t Result = 0x7F;
    unsigned int SizeIdx, PossibleSizeLength = 0;
    uint8_t PossibleSize[8];
    unsigned int i;

    *SizeUnknown = 0x7F; // the last bit is discarded when computing the size
    for (SizeIdx = 0; SizeIdx < *BufferSize && SizeIdx < 8; SizeIdx++) {
        if (InBuffer[0] & (SizeBitMask >> SizeIdx)) {
            // ID found
            PossibleSizeLength = SizeIdx + 1;
            SizeBitMask >>= SizeIdx;
            for (SizeIdx = 0; SizeIdx < PossibleSizeLength; SizeIdx++) {
                PossibleSize[SizeIdx] = InBuffer[SizeIdx];
            }
            for (SizeIdx = 0; SizeIdx < PossibleSizeLength - 1; SizeIdx++) {
                Result <<= 7;
                Result |= 0xFF;
            }

            Result = 0;
            Result |= PossibleSize[0] & ~SizeBitMask;
            for (i = 1; i<PossibleSizeLength; i++) {
                Result <<= 8;
                Result |= PossibleSize[i];
            }

            *BufferSize = PossibleSizeLength;

            return Result;
        }
        *SizeUnknown <<= 7;
        *SizeUnknown |= 0xFF;
    }

    *BufferSize = 0;
    return 0;
}